

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

shared_ptr<kratos::SwitchStmt> __thiscall
kratos::TransformIfCase::change_if_to_switch
          (TransformIfCase *this,shared_ptr<kratos::IfStmt> *stmt,
          vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
          *if_stmts)

{
  Var *pVVar1;
  element_type *peVar2;
  SwitchStmt *pSVar3;
  element_type *peVar4;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  pointer psVar7;
  shared_ptr<kratos::IfStmt> *psVar8;
  element_type *peVar9;
  int iVar10;
  undefined4 extraout_var;
  __normal_iterator<const_std::shared_ptr<kratos::IfStmt>_*,_std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>_>
  _Var11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  shared_ptr<kratos::SwitchStmt> sVar13;
  undefined1 local_80 [8];
  shared_ptr<kratos::Expr> expr;
  shared_ptr<kratos::Const> condition;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_48 [16];
  element_type *local_38;
  shared_ptr<kratos::SwitchStmt> *switch_;
  
  local_38 = (element_type *)this;
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(((stmt->super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  Var::as<kratos::Expr>((Var *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&condition);
  pVVar1 = *(Var **)((long)local_80 + 0x278);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &pVVar1->super_enable_shared_from_this<kratos::Var>);
  std::make_shared<kratos::SwitchStmt,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::Var> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&condition);
  iVar10 = (*(pVVar1->super_IRNode)._vptr_IRNode[0xd])(pVVar1);
  if (*(char *)(CONCAT44(extraout_var,iVar10) + 0xbc) == '\x01') {
    peVar2 = (stmt->super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (peVar2->super_Stmt).super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (peVar2->super_Stmt).super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_48);
    peVar9 = local_38;
    p_Var12 = &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::_M_move_assign((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)((local_38->super_Stmt).super_IRNode._vptr_IRNode + 1),p_Var12);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)p_Var12);
    expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_74acbb;
    condition.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x55;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)((peVar9->super_Stmt).super_IRNode._vptr_IRNode + 1),
               (pair<const_char_*,_int> *)
               &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  do {
    p_Var12 = &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::IfStmt>const*,std::vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<kratos::IfStmt>const>>
                       ((if_stmts->
                        super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        (if_stmts->
                        super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish,stmt);
    if (_Var11._M_current ==
        (if_stmts->
        super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
LAB_00203df6:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
      sVar13.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar13.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
      return (shared_ptr<kratos::SwitchStmt>)
             sVar13.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>;
    }
    Var::as<kratos::Const>((Var *)p_Var12);
    pSVar3 = (SwitchStmt *)(local_38->super_Stmt).super_IRNode._vptr_IRNode;
    std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::ScopedStmtBlock,void>
              ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)local_48,
               &(((stmt->super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                then_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)
    ;
    SwitchStmt::add_switch_case
              (pSVar3,(shared_ptr<kratos::Const> *)p_Var12,(shared_ptr<kratos::Stmt> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    peVar4 = (((stmt->super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             else_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var5 = *(__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> **)
              &(peVar4->super_StmtBlock).stmts_.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data;
    if (p_Var5 == &((peVar4->super_StmtBlock).stmts_.
                    super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>) {
LAB_00203ded:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&condition);
      goto LAB_00203df6;
    }
    psVar6 = (if_stmts->
             super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar7 = (if_stmts->
             super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_48,p_Var5);
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::IfStmt>const*,std::vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<kratos::Stmt>const>>
                       (psVar6,psVar7,
                        (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    psVar8 = (if_stmts->
             super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    peVar2 = (stmt->super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (_Var11._M_current == psVar8) {
      pSVar3 = (SwitchStmt *)(local_38->super_Stmt).super_IRNode._vptr_IRNode;
      local_48._0_8_ = 0;
      local_48._8_8_ = 0;
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<kratos::ScopedStmtBlock,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 &(peVar2->else_body_).
                  super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>);
      SwitchStmt::add_switch_case
                (pSVar3,(shared_ptr<kratos::Const> *)local_48,(shared_ptr<kratos::Stmt> *)&local_58)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
      goto LAB_00203ded;
    }
    peVar4 = (peVar2->else_body_).
             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var5 = *(__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> **)
              &(peVar4->super_StmtBlock).stmts_.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data;
    if (p_Var5 == &((peVar4->super_StmtBlock).stmts_.
                    super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>) goto LAB_00203ded;
    std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)&local_58,p_Var5);
    Stmt::as<kratos::IfStmt>((Stmt *)local_48);
    std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&stmt->super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               &(((stmt->super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    Var::as<kratos::Expr>((Var *)local_48);
    std::__shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_80,
               (__shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&condition);
  } while( true );
}

Assistant:

std::shared_ptr<SwitchStmt> static change_if_to_switch(
        std::shared_ptr<IfStmt> stmt, const std::vector<std::shared_ptr<IfStmt>>& if_stmts) {
        auto expr = stmt->predicate()->as<Expr>();
        // we assume that this is a valid case (see has_target_if)
        auto* target = expr->left;
        std::shared_ptr<SwitchStmt> switch_ =
            std::make_shared<SwitchStmt>(target->shared_from_this());
        if (target->generator()->debug) {
            switch_->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                stmt->fn_name_ln.begin(), stmt->fn_name_ln.end());
            switch_->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }

        while (std::find(if_stmts.begin(), if_stmts.end(), stmt) != if_stmts.end()) {
            auto condition = expr->right->as<Const>();
            switch_->add_switch_case(condition, stmt->then_body());
            if (!stmt->else_body()->empty() &&
                std::find(if_stmts.begin(), if_stmts.end(), (*stmt->else_body())[0]) ==
                    if_stmts.end()) {
                // we have reached the end
                // add default statement
                switch_->add_switch_case(nullptr, stmt->else_body());
                break;
            } else if (!stmt->else_body()->empty()) {
                // switch to the else case
                stmt = (*stmt->else_body())[0]->as<IfStmt>();
                expr = stmt->predicate()->as<Expr>();
            } else {
                break;
            }
        }

        return switch_;
    }